

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O1

void test_serialize(void)

{
  ulong uVar1;
  _Bool _Var2;
  uint uVar3;
  roaring_bitmap_t *prVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  roaring_bitmap_t *prVar8;
  uint64_t uVar9;
  uint32_t *puVar10;
  uint64_t uVar11;
  uint32_t *puVar12;
  run_container_t *run;
  roaring_array_t *ra;
  roaring_bitmap_t *prVar13;
  ulong uVar14;
  uint32_t k;
  uint i;
  uint32_t uVar15;
  uint uVar16;
  unsigned_long uVar17;
  int iVar18;
  undefined8 local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined8 uStack_64;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  local_48 = 0x3e800000064;
  uStack_40 = 0xf424000002710;
  local_58 = 0x100000000;
  uStack_50 = 0x300000002;
  local_38 = 20000000;
  prVar4 = roaring_bitmap_of_ptr(8,(uint32_t *)((long)&local_58 + 4));
  _assert_true((unsigned_long)prVar4,"r1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x592);
  uVar15 = 0;
  do {
    roaring_bitmap_add(prVar4,uVar15);
    uVar15 = uVar15 + 3;
  } while (uVar15 != 0x119400);
  sVar5 = roaring_bitmap_size_in_bytes(prVar4);
  pcVar6 = (char *)malloc(sVar5);
  sVar5 = roaring_bitmap_serialize(prVar4,pcVar6);
  sVar7 = roaring_bitmap_size_in_bytes(prVar4);
  _assert_int_equal(sVar5 & 0xffffffff,sVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                    ,0x59d);
  prVar8 = roaring_bitmap_deserialize(pcVar6);
  _assert_true((unsigned_long)prVar8,"r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x59f);
  uVar9 = roaring_bitmap_get_cardinality(prVar4);
  puVar10 = (uint32_t *)malloc(uVar9 * 4);
  roaring_bitmap_to_uint32_array(prVar4,puVar10);
  uVar11 = roaring_bitmap_get_cardinality(prVar8);
  puVar12 = (uint32_t *)malloc(uVar11 * 4);
  roaring_bitmap_to_uint32_array(prVar8,puVar12);
  iVar18 = 0;
  uVar16 = (uint)uVar9;
  if (uVar16 == (uint)uVar11) {
    uVar3 = (uint)((int)uVar16 < 1);
    if (0 < (int)uVar16) {
      if (*puVar10 == *puVar12) {
        uVar1 = 1;
        do {
          uVar14 = uVar1;
          if ((uVar16 & 0x7fffffff) == uVar14) break;
          uVar1 = uVar14 + 1;
        } while (puVar10[uVar14] == puVar12[uVar14]);
        uVar3 = (uint)((uVar16 & 0x7fffffff) <= uVar14);
      }
      else {
        uVar3 = 0;
      }
    }
    uVar17 = (unsigned_long)uVar3;
  }
  else {
    uVar17 = 0;
  }
  _assert_true(uVar17,"array_equals(arr1, card1, arr2, card2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x5a9);
  _Var2 = roaring_bitmap_equals(prVar4,prVar8);
  _assert_true((ulong)_Var2,"roaring_bitmap_equals(r1, r2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x5aa);
  free(puVar10);
  free(puVar12);
  free(pcVar6);
  roaring_bitmap_free(prVar4);
  roaring_bitmap_free(prVar8);
  run = run_container_create_given_capacity(0x400);
  _assert_true((unsigned_long)run,"run",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x5b3);
  do {
    run_container_add(run,(uint16_t)iVar18);
    iVar18 = iVar18 + 3;
  } while (iVar18 != 0x900);
  ra = &roaring_bitmap_create_with_capacity(1)->high_low_container;
  ra_append(ra,0,run,'\x03');
  sVar5 = roaring_bitmap_size_in_bytes((roaring_bitmap_t *)ra);
  iVar18 = (int)sVar5;
  pcVar6 = (char *)malloc(sVar5 & 0xffffffff);
  sVar7 = roaring_bitmap_serialize((roaring_bitmap_t *)ra,pcVar6);
  _assert_int_equal((long)iVar18,sVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                    ,0x5bc);
  prVar4 = roaring_bitmap_deserialize(pcVar6);
  _Var2 = roaring_bitmap_equals((roaring_bitmap_t *)ra,prVar4);
  _assert_true((ulong)_Var2,"roaring_bitmap_equals(r1, r2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x5be);
  prVar8 = roaring_bitmap_deserialize_safe(pcVar6,0);
  _assert_true((ulong)(prVar8 == (roaring_bitmap_t *)0x0),
               "roaring_bitmap_deserialize_safe(serialized, 0)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x5c2);
  prVar8 = roaring_bitmap_deserialize_safe(pcVar6,(ulong)(iVar18 - 1));
  _assert_true((ulong)(prVar8 == (roaring_bitmap_t *)0x0),
               "roaring_bitmap_deserialize_safe(serialized, serialize_len - 1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x5c3);
  prVar8 = roaring_bitmap_deserialize_safe(pcVar6,sVar5 & 0xffffffff);
  _Var2 = roaring_bitmap_equals((roaring_bitmap_t *)ra,prVar8);
  _assert_true((ulong)_Var2,"roaring_bitmap_equals(r1, t_safe)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x5c9);
  roaring_bitmap_free(prVar8);
  prVar8 = roaring_bitmap_deserialize_safe(pcVar6,(ulong)(iVar18 + 10));
  _Var2 = roaring_bitmap_equals((roaring_bitmap_t *)ra,prVar8);
  _assert_true((ulong)_Var2,"roaring_bitmap_equals(r1, t_safe)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x5cf);
  roaring_bitmap_free(prVar8);
  free(pcVar6);
  roaring_bitmap_free((roaring_bitmap_t *)ra);
  roaring_bitmap_free(prVar4);
  uStack_68 = 0xa01173;
  uStack_64 = 0x12f24cb00a0412c;
  local_78 = 0x2cf3d000000000;
  uStack_70 = 0x2dbcf3;
  uStack_6c = 0x9fe2d1;
  prVar4 = roaring_bitmap_of_ptr(6,(uint32_t *)((long)&local_78 + 4));
  sVar5 = roaring_bitmap_size_in_bytes(prVar4);
  pcVar6 = (char *)malloc(sVar5);
  sVar5 = roaring_bitmap_serialize(prVar4,pcVar6);
  sVar7 = roaring_bitmap_size_in_bytes(prVar4);
  _assert_int_equal(sVar5 & 0xffffffff,sVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                    ,0x5db);
  prVar8 = roaring_bitmap_deserialize(pcVar6);
  _assert_true((unsigned_long)prVar8,"r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x5dd);
  uVar9 = roaring_bitmap_get_cardinality(prVar4);
  puVar10 = (uint32_t *)malloc(uVar9 * 4);
  _assert_true((unsigned_long)puVar10,"arr1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x5e1);
  roaring_bitmap_to_uint32_array(prVar4,puVar10);
  uVar11 = roaring_bitmap_get_cardinality(prVar8);
  puVar12 = (uint32_t *)malloc(uVar11 * 4);
  _assert_true((unsigned_long)puVar12,"arr2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x5e6);
  roaring_bitmap_to_uint32_array(prVar8,puVar12);
  uVar17 = 0;
  uVar16 = (uint)uVar9;
  if (uVar16 == (uint)uVar11) {
    uVar3 = (uint)((int)uVar16 < 1);
    if (0 < (int)uVar16) {
      if (*puVar10 == *puVar12) {
        uVar1 = 1;
        do {
          uVar14 = uVar1;
          if ((uVar16 & 0x7fffffff) == uVar14) break;
          uVar1 = uVar14 + 1;
        } while (puVar10[uVar14] == puVar12[uVar14]);
        uVar3 = (uint)((uVar16 & 0x7fffffff) <= uVar14);
      }
      else {
        uVar3 = 0;
      }
    }
    uVar17 = (unsigned_long)uVar3;
  }
  _assert_true(uVar17,"array_equals(arr1, card1, arr2, card2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x5e9);
  _Var2 = roaring_bitmap_equals(prVar4,prVar8);
  _assert_true((ulong)_Var2,"roaring_bitmap_equals(r1, r2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x5ea);
  free(puVar10);
  free(puVar12);
  free(pcVar6);
  roaring_bitmap_free(prVar4);
  roaring_bitmap_free(prVar8);
  prVar4 = roaring_bitmap_create_with_capacity(0);
  uVar15 = 100;
  do {
    roaring_bitmap_add(prVar4,uVar15);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 100000);
  roaring_bitmap_run_optimize(prVar4);
  sVar5 = roaring_bitmap_size_in_bytes(prVar4);
  pcVar6 = (char *)malloc(sVar5);
  sVar5 = roaring_bitmap_serialize(prVar4,pcVar6);
  sVar7 = roaring_bitmap_size_in_bytes(prVar4);
  _assert_int_equal(sVar5 & 0xffffffff,sVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                    ,0x5f8);
  prVar8 = roaring_bitmap_deserialize(pcVar6);
  uVar9 = roaring_bitmap_get_cardinality(prVar4);
  puVar10 = (uint32_t *)malloc(uVar9 * 4);
  _assert_true((unsigned_long)puVar10,"arr1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x5fd);
  roaring_bitmap_to_uint32_array(prVar4,puVar10);
  uVar11 = roaring_bitmap_get_cardinality(prVar8);
  puVar12 = (uint32_t *)malloc(uVar11 * 4);
  _assert_true((unsigned_long)puVar12,"arr2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x602);
  roaring_bitmap_to_uint32_array(prVar8,puVar12);
  uVar15 = 0;
  uVar16 = (uint)uVar9;
  if (uVar16 == (uint)uVar11) {
    uVar3 = (uint)((int)uVar16 < 1);
    if (0 < (int)uVar16) {
      if (*puVar10 == *puVar12) {
        uVar1 = 1;
        do {
          uVar14 = uVar1;
          if ((uVar16 & 0x7fffffff) == uVar14) break;
          uVar1 = uVar14 + 1;
        } while (puVar10[uVar14] == puVar12[uVar14]);
        uVar3 = (uint)((uVar16 & 0x7fffffff) <= uVar14);
      }
      else {
        uVar3 = 0;
      }
    }
    uVar17 = (unsigned_long)uVar3;
  }
  else {
    uVar17 = 0;
  }
  _assert_true(uVar17,"array_equals(arr1, card1, arr2, card2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x605);
  _Var2 = roaring_bitmap_equals(prVar4,prVar8);
  _assert_true((ulong)_Var2,"roaring_bitmap_equals(r1, r2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x606);
  free(puVar10);
  free(puVar12);
  free(pcVar6);
  roaring_bitmap_free(prVar4);
  roaring_bitmap_free(prVar8);
  prVar4 = roaring_bitmap_create_with_capacity(0);
  do {
    roaring_bitmap_add(prVar4,uVar15);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0x66);
  sVar5 = roaring_bitmap_size_in_bytes(prVar4);
  pcVar6 = (char *)malloc(sVar5);
  sVar5 = roaring_bitmap_serialize(prVar4,pcVar6);
  sVar7 = roaring_bitmap_size_in_bytes(prVar4);
  _assert_int_equal(sVar5 & 0xffffffff,sVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                    ,0x613);
  prVar8 = roaring_bitmap_deserialize(pcVar6);
  prVar13 = roaring_bitmap_deserialize_safe(pcVar6,(ulong)((int)sVar5 - 1));
  _assert_true((ulong)(prVar13 == (roaring_bitmap_t *)0x0),
               "roaring_bitmap_deserialize_safe(buff, size - 1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x617);
  prVar13 = roaring_bitmap_deserialize_safe(pcVar6,sVar5 & 0xffffffff);
  _Var2 = roaring_bitmap_equals(prVar8,prVar13);
  _assert_true((ulong)_Var2,"roaring_bitmap_equals(new_bm, t_safe)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x61a);
  roaring_bitmap_free(prVar13);
  free(pcVar6);
  uVar9 = roaring_bitmap_get_cardinality(prVar4);
  uVar11 = roaring_bitmap_get_cardinality(prVar8);
  _assert_true((ulong)((int)uVar9 == (int)uVar11),
               "(unsigned int)roaring_bitmap_get_cardinality(old_bm) == (unsigned int)roaring_bitmap_get_cardinality(new_bm)"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x61f);
  _Var2 = roaring_bitmap_equals(prVar4,prVar8);
  _assert_true((ulong)_Var2,"roaring_bitmap_equals(old_bm, new_bm)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x620);
  roaring_bitmap_free(prVar4);
  roaring_bitmap_free(prVar8);
  return;
}

Assistant:

DEFINE_TEST(test_serialize) {
    roaring_bitmap_t *r1 =
        roaring_bitmap_from(1, 2, 3, 100, 1000, 10000, 1000000, 20000000);
    assert_non_null(r1);

    uint32_t serialize_len;
    char *serialized;
    roaring_bitmap_t *r2;

    /* Add some values to the bitmap */
    for (int i = 0, top_val = 384000; i < top_val; i++)
        roaring_bitmap_add(r1, 3 * i);
    serialized = (char *)malloc(roaring_bitmap_size_in_bytes(r1));
    serialize_len = roaring_bitmap_serialize(r1, serialized);
    assert_int_equal(serialize_len, roaring_bitmap_size_in_bytes(r1));
    r2 = roaring_bitmap_deserialize(serialized);
    assert_non_null(r2);

    uint64_t card1 = roaring_bitmap_get_cardinality(r1);
    uint32_t *arr1 = (uint32_t *)malloc(card1 * sizeof(uint32_t));
    roaring_bitmap_to_uint32_array(r1, arr1);

    uint64_t card2 = roaring_bitmap_get_cardinality(r2);
    uint32_t *arr2 = (uint32_t *)malloc(card2 * sizeof(uint32_t));
    roaring_bitmap_to_uint32_array(r2, arr2);

    assert_true(array_equals(arr1, card1, arr2, card2));
    assert_true(roaring_bitmap_equals(r1, r2));
    free(arr1);
    free(arr2);
    free(serialized);
    roaring_bitmap_free(r1);
    roaring_bitmap_free(r2);

    /* manually create a run container, and inject ito a roaring bitmap */
    run_container_t *run = run_container_create_given_capacity(1024);
    assert_non_null(run);
    for (int i = 0; i < 768; i++) run_container_add(run, 3 * i);

    r1 = roaring_bitmap_create_with_capacity(1);
    ra_append(&r1->high_low_container, 0, run, RUN_CONTAINER_TYPE);

    serialize_len = roaring_bitmap_size_in_bytes(r1);
    serialized = (char *)malloc(serialize_len);
    assert_int_equal((int32_t)serialize_len,
                     roaring_bitmap_serialize(r1, serialized));
    r2 = roaring_bitmap_deserialize(serialized);
    assert_true(roaring_bitmap_equals(r1, r2));

    // Check that roaring_bitmap_deserialize_safe fails on invalid length

    assert_null(roaring_bitmap_deserialize_safe(serialized, 0));
    assert_null(roaring_bitmap_deserialize_safe(serialized, serialize_len - 1));

    // Check that roaring_bitmap_deserialize_safe succeed with valid length

    roaring_bitmap_t *t_safe =
        roaring_bitmap_deserialize_safe(serialized, serialize_len);
    assert_true(roaring_bitmap_equals(r1, t_safe));
    roaring_bitmap_free(t_safe);

    // Check that roaring_bitmap_deserialize_safe succeed with larger length

    t_safe = roaring_bitmap_deserialize_safe(serialized, serialize_len + 10);
    assert_true(roaring_bitmap_equals(r1, t_safe));
    roaring_bitmap_free(t_safe);

    free(serialized);
    roaring_bitmap_free(r1);
    roaring_bitmap_free(r2);

    r1 = roaring_bitmap_from(2946000, 2997491, 10478289, 10490227, 10502444,
                             19866827);

    serialized = (char *)malloc(roaring_bitmap_size_in_bytes(r1));
    serialize_len = roaring_bitmap_serialize(r1, serialized);
    assert_int_equal(serialize_len, roaring_bitmap_size_in_bytes(r1));
    r2 = roaring_bitmap_deserialize(serialized);
    assert_non_null(r2);

    card1 = roaring_bitmap_get_cardinality(r1);
    arr1 = (uint32_t *)malloc(card1 * sizeof(uint32_t));
    assert_non_null(arr1);
    roaring_bitmap_to_uint32_array(r1, arr1);

    card2 = roaring_bitmap_get_cardinality(r2);
    arr2 = (uint32_t *)malloc(card2 * sizeof(uint32_t));
    assert_non_null(arr2);
    roaring_bitmap_to_uint32_array(r2, arr2);

    assert_true(array_equals(arr1, card1, arr2, card2));
    assert_true(roaring_bitmap_equals(r1, r2));
    free(arr1);
    free(arr2);
    free(serialized);
    roaring_bitmap_free(r1);
    roaring_bitmap_free(r2);

    r1 = roaring_bitmap_create();
    for (uint32_t k = 100; k < 100000; ++k) {
        roaring_bitmap_add(r1, k);
    }
    roaring_bitmap_run_optimize(r1);
    serialized = (char *)malloc(roaring_bitmap_size_in_bytes(r1));
    serialize_len = roaring_bitmap_serialize(r1, serialized);
    assert_int_equal(serialize_len, roaring_bitmap_size_in_bytes(r1));
    r2 = roaring_bitmap_deserialize(serialized);

    card1 = roaring_bitmap_get_cardinality(r1);
    arr1 = (uint32_t *)malloc(card1 * sizeof(uint32_t));
    assert_non_null(arr1);
    roaring_bitmap_to_uint32_array(r1, arr1);

    card2 = roaring_bitmap_get_cardinality(r2);
    arr2 = (uint32_t *)malloc(card2 * sizeof(uint32_t));
    assert_non_null(arr2);
    roaring_bitmap_to_uint32_array(r2, arr2);

    assert_true(array_equals(arr1, card1, arr2, card2));
    assert_true(roaring_bitmap_equals(r1, r2));

    free(arr1);
    free(arr2);
    free(serialized);
    roaring_bitmap_free(r1);
    roaring_bitmap_free(r2);

    /* ******* */
    roaring_bitmap_t *old_bm = roaring_bitmap_create();
    for (unsigned i = 0; i < 102; i++) roaring_bitmap_add(old_bm, i);
    char *buff = (char *)malloc(roaring_bitmap_size_in_bytes(old_bm));
    uint32_t size = roaring_bitmap_serialize(old_bm, buff);
    assert_int_equal(size, roaring_bitmap_size_in_bytes(old_bm));
    roaring_bitmap_t *new_bm = roaring_bitmap_deserialize(buff);

    // Check that roaring_bitmap_deserialize_safe fails on invalid length
    assert_null(roaring_bitmap_deserialize_safe(buff, size - 1));
    // Check that roaring_bitmap_deserialize_safe succeed with valid length
    t_safe = roaring_bitmap_deserialize_safe(buff, size);
    assert_true(roaring_bitmap_equals(new_bm, t_safe));
    roaring_bitmap_free(t_safe);

    free(buff);
    assert_true((unsigned int)roaring_bitmap_get_cardinality(old_bm) ==
                (unsigned int)roaring_bitmap_get_cardinality(new_bm));
    assert_true(roaring_bitmap_equals(old_bm, new_bm));
    roaring_bitmap_free(old_bm);
    roaring_bitmap_free(new_bm);
}